

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableNeuralNetworkValidator.cpp
# Opt level: O1

Result * validateTrainingInputs<CoreML::Specification::NeuralNetwork>
                   (Result *__return_storage_ptr__,ModelDescription *modelDescription,
                   NeuralNetwork *nn)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  Type *pTVar4;
  Type *b;
  LogMessage *pLVar5;
  long *plVar6;
  bool bVar7;
  undefined1 *puVar8;
  int iVar9;
  ulong uVar10;
  vector<int,_std::allocator<int>_> trainingInputExclusiveIndices;
  string err;
  string trainingInputTarget;
  string target;
  Result r;
  int *local_188;
  iterator iStack_180;
  int *local_178;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  LogMessage local_110;
  NeuralNetwork *local_d8;
  RepeatedPtrFieldBase *local_d0;
  Result local_c8;
  LogMessage local_a0;
  LogMessage local_68;
  
  local_d8 = nn;
  CoreML::Result::Result(&local_c8);
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  local_170._M_string_length = 0;
  local_170.field_2._M_local_buf[0] = '\0';
  if ((modelDescription->traininginput_).super_RepeatedPtrFieldBase.current_size_ < 2) {
    std::__cxx11::string::_M_replace((ulong)&local_170,0,(char *)0x0,0x3dd090);
    CoreML::Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_170);
    goto LAB_00324b6e;
  }
  local_188 = (int *)0x0;
  iStack_180._M_current = (int *)0x0;
  local_178 = (int *)0x0;
  local_110.level_ = LOGLEVEL_INFO;
  iVar9 = (modelDescription->traininginput_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < iVar9) {
    local_d0 = &(modelDescription->traininginput_).super_RepeatedPtrFieldBase;
    do {
      pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                         (local_d0,local_110.level_);
      if ((modelDescription->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
LAB_0032475a:
        if (iStack_180._M_current == local_178) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_188,iStack_180,(int *)&local_110);
        }
        else {
          *iStack_180._M_current = local_110.level_;
          iStack_180._M_current = iStack_180._M_current + 1;
        }
      }
      else {
        iVar9 = 1;
        bVar7 = false;
        do {
          b = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                        (&(modelDescription->input_).super_RepeatedPtrFieldBase,iVar9 + -1);
          bVar3 = CoreML::Specification::isEquivalent(pTVar4,b);
          if (bVar3) {
            bVar7 = true;
          }
          bVar2 = iVar9 < (modelDescription->input_).super_RepeatedPtrFieldBase.current_size_;
          iVar9 = iVar9 + 1;
        } while (bVar2 && !bVar3);
        if (!bVar7) goto LAB_0032475a;
      }
      local_110.level_ = local_110.level_ + LOGLEVEL_WARNING;
      iVar9 = (modelDescription->traininginput_).super_RepeatedPtrFieldBase.current_size_;
    } while ((int)local_110.level_ < iVar9);
  }
  if ((long)iStack_180._M_current - (long)local_188 == 0) {
    std::__cxx11::string::_M_replace
              ((ulong)&local_170,0,(char *)local_170._M_string_length,0x3dd0ff);
    CoreML::Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_170);
  }
  else if ((long)iStack_180._M_current - (long)local_188 >> 2 == (long)iVar9) {
    std::__cxx11::string::_M_replace
              ((ulong)&local_170,0,(char *)local_170._M_string_length,0x3dd162);
    CoreML::Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_170);
  }
  else {
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    local_130._M_string_length = 0;
    local_130.field_2._M_local_buf[0] = '\0';
    puVar8 = (undefined1 *)local_d8->updateparams_;
    if ((NetworkUpdateParameters *)puVar8 == (NetworkUpdateParameters *)0x0) {
      puVar8 = CoreML::Specification::_NetworkUpdateParameters_default_instance_;
    }
    if ((((NetworkUpdateParameters *)puVar8)->losslayers_).super_RepeatedPtrFieldBase.current_size_
        < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                 ,0x358);
      pLVar5 = google::protobuf::internal::LogMessage::operator<<
                         (&local_68,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_110,pLVar5);
      google::protobuf::internal::LogMessage::~LogMessage(&local_68);
    }
    iVar9 = (((NetworkUpdateParameters *)puVar8)->losslayers_).super_RepeatedPtrFieldBase.
            current_size_;
    if (*(int *)((long)((((NetworkUpdateParameters *)puVar8)->losslayers_).
                        super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x24) == 10) {
      if (iVar9 < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_110,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                   ,0x358);
        pLVar5 = google::protobuf::internal::LogMessage::operator<<
                           (&local_110,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_a0,pLVar5);
        google::protobuf::internal::LogMessage::~LogMessage(&local_110);
      }
LAB_003249f1:
      std::__cxx11::string::_M_assign((string *)&local_130);
    }
    else {
      if (iVar9 < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_a0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                   ,0x358);
        pLVar5 = google::protobuf::internal::LogMessage::operator<<
                           (&local_a0,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_110,pLVar5);
        google::protobuf::internal::LogMessage::~LogMessage(&local_a0);
      }
      if (*(int *)((long)((((NetworkUpdateParameters *)puVar8)->losslayers_).
                          super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x24) == 0xb) {
        if ((((NetworkUpdateParameters *)puVar8)->losslayers_).super_RepeatedPtrFieldBase.
            current_size_ < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    (&local_110,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                     ,0x358);
          pLVar5 = google::protobuf::internal::LogMessage::operator<<
                             (&local_110,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_150,pLVar5);
          google::protobuf::internal::LogMessage::~LogMessage(&local_110);
        }
        goto LAB_003249f1;
      }
    }
    if (iStack_180._M_current == local_188) {
LAB_00324ae7:
      std::operator+(&local_150,"The training inputs don\'t include the loss layer\'s target: ",
                     &local_130);
      std::__cxx11::string::operator=((string *)&local_170,(string *)&local_150);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
      }
      CoreML::Result::Result
                (__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_170);
    }
    else {
      uVar10 = 0;
      bVar3 = false;
      bVar7 = false;
      do {
        pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                           (&(modelDescription->traininginput_).super_RepeatedPtrFieldBase,
                            local_188[uVar10]);
        plVar6 = (long *)((ulong)(pTVar4->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
        lVar1 = *plVar6;
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        std::__cxx11::string::_M_construct<char*>((string *)&local_150,lVar1,plVar6[1] + lVar1);
        if (local_130._M_string_length == local_150._M_string_length) {
          if (local_130._M_string_length == 0) {
            bVar7 = true;
            bVar3 = true;
          }
          else {
            iVar9 = bcmp(local_130._M_dataplus._M_p,local_150._M_dataplus._M_p,
                         local_130._M_string_length);
            bVar7 = bVar3;
            if (iVar9 == 0) {
              bVar7 = true;
              bVar3 = bVar7;
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 < (ulong)((long)iStack_180._M_current - (long)local_188 >> 2));
      if (!bVar7) goto LAB_00324ae7;
      CoreML::Result::Result(__return_storage_ptr__);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,
                      CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                               local_130.field_2._M_local_buf[0]) + 1);
    }
  }
  if (local_188 != (int *)0x0) {
    operator_delete(local_188,(long)local_178 - (long)local_188);
  }
LAB_00324b6e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,
                    CONCAT71(local_170.field_2._M_allocated_capacity._1_7_,
                             local_170.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.m_message._M_dataplus._M_p != &local_c8.m_message.field_2) {
    operator_delete(local_c8.m_message._M_dataplus._M_p,
                    local_c8.m_message.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result validateTrainingInputs(const Specification::ModelDescription& modelDescription, const T& nn) {
    Result r;
    std::string err;

    if (modelDescription.traininginput_size() <= 1) {
        err = "Must provide training inputs for updatable neural network (expecting both input and target for loss function).";
        return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
    }

    std::vector<int> trainingInputExclusiveIndices;
    for (int i = 0; i < modelDescription.traininginput_size(); i++) {
        const Specification::FeatureDescription& trainingInput = modelDescription.traininginput(i);
        bool trainingInputIsPredictionInput = false;
        for (int j = 0; j < modelDescription.input_size(); j++) {
            const Specification::FeatureDescription& input = modelDescription.input(j);
            if (Specification::isEquivalent(trainingInput, input)) {
                trainingInputIsPredictionInput = true;
                break;
            }
        }
        if (!trainingInputIsPredictionInput) {
            trainingInputExclusiveIndices.push_back(i);
        }
    }

    // Check that training inputs are specified to at least contain the target (which we'll validate is the target further down)
    if (trainingInputExclusiveIndices.size() < 1) {
        err = "Training inputs don't describe required inputs for the loss (needs both the input and the target).";
        return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
    }

    // Ensure other inputs (excluding the target) are present
    // This should prevent issues where the only training input described is the target itself
    // Given we don't yet know what inputs are explicitly required for training we can't vet beyond this for what model inputs to require
    size_t numberOfNonExclusiveTrainingInputs = static_cast<size_t>(modelDescription.traininginput_size()) - trainingInputExclusiveIndices.size();
    if (numberOfNonExclusiveTrainingInputs <= 0) { // Given at least one input from the inference model's inputs must be supplied this should be positive
        err = "The training inputs must include at least one input from the model itself as required for training (should have at least one input in common with those used for prediction).";
        return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
    }

    std::string target;
    const Specification::NetworkUpdateParameters& updateParams = nn.updateparams();
    if (updateParams.losslayers(0).has_categoricalcrossentropylosslayer()) {
        target = updateParams.losslayers(0).categoricalcrossentropylosslayer().target();
    } else if (updateParams.losslayers(0).has_meansquarederrorlosslayer()) {
        target = updateParams.losslayers(0).meansquarederrorlosslayer().target();
    }

    bool isClassifier = (dynamic_cast<const Specification::NeuralNetworkClassifier*>(&nn) != nullptr);

    bool trainingInputMeetsRequirement = false;
    for (size_t i = 0; i < trainingInputExclusiveIndices.size(); i++) {
        const Specification::FeatureDescription& trainingInputDescription = modelDescription.traininginput(trainingInputExclusiveIndices[i]);
        std::string trainingInputTarget = trainingInputDescription.name();

        // If the neural network is a classifier, check if the predictedFeatureNames is a training input (and ensure matching types)
        if (isClassifier) {
            if (trainingInputTarget == modelDescription.predictedfeaturename()) {

                // Find the predictedFeatureName's output and use to check types
                for (const auto& output : modelDescription.output()) {
                    if (trainingInputTarget == output.name()) {
                        if (trainingInputDescription.type() == output.type()) {
                            trainingInputMeetsRequirement = true;
                            break;
                        } else {
                            std::string typeString = output.type().has_int64type() ? "Int64" : "String";
                            std::string targetTypeString = trainingInputDescription.type().has_int64type() ? "Int64" : "String";
                            err = "The type of the training input provided: " + trainingInputTarget + " doesn't match the expected type of the classifier. Found: " + targetTypeString + ", expected: " + typeString + ".";
                            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
                        }
                    }
                }
            }
        }

        // If NN was not a classifier (or predictedFeatureName was not in the training inputs), ensure the target is in the training inputs
        if (target == trainingInputTarget) {
            trainingInputMeetsRequirement = true;
        }
    }

    // Raise an error if the target isn't found (or if the target or predictedFeatureNames aren't found for classifiers)
    // Users can supply either / or for a classifier, but if neither is found we'll request the predictedFeatureNames
    if (!trainingInputMeetsRequirement) {
        if (isClassifier) {
            err = "The training inputs don't include the target of the classifier: " + modelDescription.predictedfeaturename();
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
        }
        err = "The training inputs don't include the loss layer's target: " + target;
        return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
    }

    return Result();
}